

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

QCborValue * __thiscall
QJsonPrivate::Parser::parseNumber(QCborValue *__return_storage_ptr__,Parser *this)

{
  byte *data;
  byte *pbVar1;
  bool bVar2;
  qlonglong qVar3;
  byte *pbVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  double dVar6;
  bool ok;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  data = (byte *)this->json;
  pbVar1 = (byte *)this->end;
  pbVar4 = data;
  if ((data < pbVar1) && (*data == 0x2d)) {
    pbVar4 = data + 1;
    this->json = (char *)pbVar4;
  }
  if ((pbVar4 < pbVar1) && (*pbVar4 == 0x30)) {
    pbVar4 = pbVar4 + 1;
    this->json = (char *)pbVar4;
  }
  else {
    while ((pbVar4 < pbVar1 && ((int)(char)*pbVar4 - 0x30U < 10))) {
      pbVar4 = pbVar4 + 1;
      this->json = (char *)pbVar4;
    }
  }
  bVar2 = true;
  if ((pbVar4 < pbVar1) && (*pbVar4 == 0x2e)) {
    bVar2 = true;
    while( true ) {
      pbVar4 = pbVar4 + 1;
      this->json = (char *)pbVar4;
      if ((pbVar1 <= pbVar4) || (9 < (int)(char)*pbVar4 - 0x30U)) break;
      bVar2 = (bool)(bVar2 & *pbVar4 == 0x30);
    }
  }
  if ((pbVar4 < pbVar1) && ((*pbVar4 | 0x20) == 0x65)) {
    pbVar5 = pbVar4 + 1;
    this->json = (char *)pbVar5;
    if (pbVar1 <= pbVar5) goto LAB_002c61d3;
    if ((*pbVar5 != 0x2d) && (*pbVar5 != 0x2b)) goto LAB_002c61d3;
    pbVar5 = pbVar4 + 2;
    while( true ) {
      this->json = (char *)pbVar5;
LAB_002c61d3:
      if ((pbVar1 <= pbVar5) || (9 < (int)(char)*pbVar5 - 0x30U)) break;
      pbVar5 = pbVar5 + 1;
    }
    bVar2 = false;
    pbVar4 = pbVar5;
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::fromRawData((QByteArray *)&local_38,(char *)data,(long)pbVar4 - (long)data);
  if (bVar2) {
    ok = true;
    qVar3 = QByteArray::toLongLong((QByteArray *)&local_38,&ok,10);
    if (ok != true) goto LAB_002c6236;
  }
  else {
LAB_002c6236:
    ok = true;
    dVar6 = QByteArray::toDouble((QByteArray *)&local_38,&ok);
    if (ok == false) {
      this->lastError = IllegalNumber;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Undefined;
      goto LAB_002c62bc;
    }
    qVar3 = (qlonglong)dVar6;
    if (dVar6 != (double)qVar3) {
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Double;
      __return_storage_ptr__->n = (qint64)dVar6;
      goto LAB_002c62bc;
    }
  }
  __return_storage_ptr__->n = qVar3;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Integer;
LAB_002c62bc:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parseNumber()
{
    const char *start = json;
    bool isInt = true;

    // minus
    if (json < end && *json == '-')
        ++json;

    // int = zero / ( digit1-9 *DIGIT )
    if (json < end && *json == '0') {
        ++json;
    } else {
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    // frac = decimal-point 1*DIGIT
    if (json < end && *json == '.') {
        ++json;
        while (json < end && isAsciiDigit(*json)) {
            isInt = isInt && *json == '0';
            ++json;
        }
    }

    // exp = e [ minus / plus ] 1*DIGIT
    if (json < end && (*json == 'e' || *json == 'E')) {
        isInt = false;
        ++json;
        if (json < end && (*json == '-' || *json == '+'))
            ++json;
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    const QByteArray number = QByteArray::fromRawData(start, json - start);

    if (isInt) {
        bool ok;
        qlonglong n = number.toLongLong(&ok);
        if (ok) {
            return QCborValue(n);
        }
    }

    bool ok;
    double d = number.toDouble(&ok);

    if (!ok) {
        lastError = QJsonParseError::IllegalNumber;
        return QCborValue();
    }

    qint64 n;
    if (convertDoubleTo(d, &n))
        return QCborValue(n);
    return QCborValue(d);
}